

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O3

void Imf_3_4::RgbaYca::roundYCA(int n,uint roundY,uint roundC,Rgba *ycaIn,Rgba *ycaOut)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ushort uVar4;
  uint16_t uVar5;
  uint uVar6;
  ushort uVar7;
  ushort uVar8;
  
  if (0 < n) {
    uVar2 = 9 - roundC;
    uVar3 = 0;
    do {
      uVar7 = ycaIn[uVar3].g._h;
      if (roundY < 10) {
        bVar1 = (byte)(9 - roundY);
        uVar6 = ((uVar7 & 0x7fff) >> (bVar1 & 0x1f)) +
                (uint)(((uVar7 & 0x7fff) >> (9 - roundY & 0x1f) & 1) != 0) << (bVar1 & 0x1f);
        uVar4 = (ushort)uVar6;
        if (0x7bff < (uVar6 & 0xfc00)) {
          uVar4 = uVar7 & (ushort)(-1 << (10U - (char)roundY & 0x1f));
        }
        uVar7 = uVar7 & 0x8000 | uVar4;
      }
      ycaOut[uVar3].g._h = uVar7;
      ycaOut[uVar3].a._h = ycaIn[uVar3].a._h;
      if ((uVar3 & 1) == 0) {
        uVar7 = ycaIn[uVar3].r._h;
        if (roundC < 10) {
          bVar1 = (byte)uVar2;
          uVar6 = ((uVar7 & 0x7fff) >> (bVar1 & 0x1f)) +
                  (uint)(((uVar7 & 0x7fff) >> (uVar2 & 0x1f) & 1) != 0) << (bVar1 & 0x1f);
          uVar8 = (ushort)uVar6;
          uVar4 = (ushort)(-1 << (10U - (char)roundC & 0x1f));
          if (0x7bff < (uVar6 & 0xfc00)) {
            uVar8 = uVar7 & uVar4;
          }
          ycaOut[uVar3].r._h = uVar7 & 0x8000 | uVar8;
          uVar7 = ycaIn[uVar3].b._h;
          uVar6 = ((uVar7 & 0x7fff) >> (bVar1 & 0x1f)) +
                  (uint)(((uVar7 & 0x7fff) >> (uVar2 & 0x1f) & 1) != 0) << (bVar1 & 0x1f);
          uVar8 = (ushort)uVar6;
          if (0x7bff < (uVar6 & 0xfc00)) {
            uVar8 = uVar7 & uVar4;
          }
          uVar5 = uVar7 & 0x8000 | uVar8;
        }
        else {
          ycaOut[uVar3].r._h = uVar7;
          uVar5 = ycaIn[uVar3].b._h;
        }
        ycaOut[uVar3].b._h = uVar5;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

void
roundYCA (
    int          n,
    unsigned int roundY,
    unsigned int roundC,
    const Rgba   ycaIn[/*n*/],
    Rgba         ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        ycaOut[i].g = ycaIn[i].g.round (roundY);
        ycaOut[i].a = ycaIn[i].a;

        if ((i & 1) == 0)
        {
            ycaOut[i].r = ycaIn[i].r.round (roundC);
            ycaOut[i].b = ycaIn[i].b.round (roundC);
        }
    }
}